

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O2

void __thiscall
Eigen::SparseMatrix<double,_1,_int>::sumupDuplicates(SparseMatrix<double,_1,_int> *this)

{
  double dVar1;
  Index *pIVar2;
  Scalar *pSVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  Index k;
  long lVar7;
  Scalar local_64;
  double local_60;
  long local_58;
  void *local_50;
  Matrix<int,__1,_1,_0,__1,_1> wi;
  int local_34;
  Index start;
  
  if (this->m_innerNonZeros != (Index *)0x0) {
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)&local_50,(long)this->m_innerSize);
    local_64 = -1;
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_50,&local_64);
    wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (DenseIndex)&this->m_data;
    lVar5 = 0;
    local_34 = 0;
    while( true ) {
      if (this->m_outerSize <= lVar5) break;
      lVar7 = (long)this->m_outerIndex[lVar5];
      lVar4 = this->m_innerNonZeros[lVar5] + lVar7;
      iVar6 = local_34;
      local_58 = lVar5;
      for (; lVar7 < lVar4; lVar7 = lVar7 + 1) {
        lVar5 = (long)(this->m_data).m_indices[lVar7];
        pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&local_50,
                            lVar5);
        dVar1 = *(double *)
                 (*(long *)wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows + lVar7 * 8);
        if (*pSVar3 < local_34) {
          *(double *)
           (*(long *)wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           + (long)iVar6 * 8) = dVar1;
          pIVar2 = (this->m_data).m_indices;
          pIVar2[iVar6] = pIVar2[lVar7];
          pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&local_50,
                              lVar5);
          *pSVar3 = iVar6;
          iVar6 = iVar6 + 1;
        }
        else {
          local_60 = dVar1;
          pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&local_50,
                              lVar5);
          *(double *)
           (*(long *)wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           + (long)*pSVar3 * 8) =
               local_60 +
               *(double *)
                (*(long *)wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows + (long)*pSVar3 * 8);
        }
      }
      this->m_outerIndex[local_58] = local_34;
      lVar5 = local_58 + 1;
      local_34 = iVar6;
    }
    this->m_outerIndex[this->m_outerSize] = local_34;
    free(this->m_innerNonZeros);
    this->m_innerNonZeros = (Index *)0x0;
    internal::CompressedStorage<double,_int>::resize
              ((CompressedStorage<double,_int> *)
               wi.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (long)this->m_outerIndex[this->m_outerSize],0.0);
    free(local_50);
    return;
  }
  __assert_fail("!isCompressed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                ,0x3fc,
                "void Eigen::SparseMatrix<double, 1>::sumupDuplicates() [_Scalar = double, _Flags = 1, _Index = int]"
               );
}

Assistant:

void SparseMatrix<Scalar,_Options,_Index>::sumupDuplicates()
{
  eigen_assert(!isCompressed());
  // TODO, in practice we should be able to use m_innerNonZeros for that task
  Matrix<Index,Dynamic,1> wi(innerSize());
  wi.fill(-1);
  Index count = 0;
  // for each inner-vector, wi[inner_index] will hold the position of first element into the index/value buffers
  for(Index j=0; j<outerSize(); ++j)
  {
    Index start   = count;
    Index oldEnd  = m_outerIndex[j]+m_innerNonZeros[j];
    for(Index k=m_outerIndex[j]; k<oldEnd; ++k)
    {
      Index i = m_data.index(k);
      if(wi(i)>=start)
      {
        // we already meet this entry => accumulate it
        m_data.value(wi(i)) += m_data.value(k);
      }
      else
      {
        m_data.value(count) = m_data.value(k);
        m_data.index(count) = m_data.index(k);
        wi(i) = count;
        ++count;
      }
    }
    m_outerIndex[j] = start;
  }
  m_outerIndex[m_outerSize] = count;

  // turn the matrix into compressed form
  std::free(m_innerNonZeros);
  m_innerNonZeros = 0;
  m_data.resize(m_outerIndex[m_outerSize]);
}